

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int nni_url_parse_inline(nng_url *url,char *raw)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  long lVar8;
  char cVar9;
  int i;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  char *pcVar13;
  
  sVar10 = 0;
  while( true ) {
    iVar12 = 3;
    iVar4 = iVar12;
    if (raw[sVar10] == '\0') break;
    if (raw[sVar10] == ':') {
      if ((raw[sVar10 + 1] == '/') && (raw[sVar10 + 2] == '/')) {
        pcVar13 = raw + sVar10;
        lVar8 = 0;
        goto LAB_001194cf;
      }
      break;
    }
    sVar10 = sVar10 + 1;
  }
  goto LAB_00119678;
LAB_001196f4:
  if (*pcVar13 == 0) goto LAB_00119713;
  if (*pcVar13 == 0x23) goto LAB_00119707;
  pcVar13 = pcVar13 + 1;
  goto LAB_001196f4;
LAB_00119707:
  *pcVar13 = 0;
  url->u_fragment = pcVar13 + 1;
  goto LAB_00119713;
  while( true ) {
    pcVar5 = *(char **)((long)nni_schemes + lVar8);
    iVar3 = strncmp(raw,pcVar5,sVar10);
    lVar8 = lVar8 + 8;
    if (iVar3 == 0) break;
LAB_001194cf:
    if (lVar8 == 0x100) {
      pcVar5 = url->u_scheme;
      goto LAB_00119509;
    }
  }
  url->u_scheme = pcVar5;
LAB_00119509:
  if (pcVar5 == (char *)0x0) {
    iVar4 = 9;
    goto LAB_00119678;
  }
  sVar10 = strlen(pcVar13);
  if (sVar10 < 0x80) {
    pcVar5 = url->u_static;
    sVar11 = 0;
    snprintf(pcVar5,0x80,"%s",pcVar13);
    url->u_buffer = pcVar5;
  }
  else {
    pcVar5 = nni_strdup(pcVar13);
    url->u_buffer = pcVar5;
    sVar10 = strlen(pcVar13);
    sVar11 = sVar10 + 1;
  }
  url->u_bufsz = sVar11;
  pcVar5 = pcVar5 + 3;
  pcVar13 = url->u_scheme;
  iVar3 = strcmp(pcVar13,"ipc");
  if ((((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"unix"), iVar3 == 0)) ||
      (iVar3 = strcmp(pcVar13,"abstract"), iVar3 == 0)) ||
     ((iVar3 = strcmp(pcVar13,"inproc"), iVar3 == 0 ||
      (iVar3 = strcmp(pcVar13,"socket"), pcVar13 = pcVar5, iVar3 == 0)))) {
    url->u_path = pcVar5;
    url->u_userinfo = (char *)0x0;
    url->u_hostname = (char *)0x0;
    url->u_query = (char *)0x0;
    url->u_fragment = (char *)0x0;
    return 0;
  }
  while( true ) {
    bVar1 = *pcVar13;
    if (((ulong)bVar1 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
    pcVar13 = pcVar13 + 1;
  }
  *pcVar13 = 0;
  pcVar6 = url->u_buffer;
  sVar10 = strlen(pcVar5);
  memmove(pcVar6,pcVar5,sVar10 + 1);
  *pcVar13 = bVar1;
  url->u_path = pcVar13;
  pcVar5 = url->u_buffer;
  url->u_hostname = pcVar5;
  pcVar6 = strchr(pcVar5,0x40);
  if (pcVar6 != (char *)0x0) {
    url->u_userinfo = pcVar5;
    pcVar5 = pcVar6 + 1;
    *pcVar6 = '\0';
    url->u_hostname = pcVar5;
    pcVar6 = strchr(pcVar5,0x40);
    if (pcVar6 != (char *)0x0) goto LAB_00119678;
  }
  lVar8 = 0;
  while (cVar9 = pcVar5[lVar8], (long)cVar9 != 0) {
    pp_Var7 = __ctype_tolower_loc();
    pcVar5[lVar8] = (char)(*pp_Var7)[cVar9];
    lVar8 = lVar8 + 1;
    pcVar5 = url->u_hostname;
  }
  iVar4 = nni_url_canonify_uri(pcVar13);
  if (iVar4 != 0) goto LAB_00119678;
  for (; bVar1 = *pcVar13, bVar1 != 0; pcVar13 = pcVar13 + 1) {
    if (bVar1 == 0x23) goto LAB_00119707;
    if (bVar1 == 0x3f) {
      *pcVar13 = 0;
      pcVar13 = pcVar13 + 1;
      url->u_query = pcVar13;
      goto LAB_001196f4;
    }
  }
LAB_00119713:
  pcVar13 = url->u_hostname;
  cVar9 = *pcVar13;
  if (cVar9 == '[') {
    url->u_hostname = pcVar13 + 1;
    pcVar13 = pcVar13 + 1;
    do {
      pcVar5 = pcVar13;
      iVar4 = iVar12;
      if (*pcVar5 == '\0') goto LAB_00119678;
      pcVar13 = pcVar5 + 1;
    } while (*pcVar5 != ']');
    *pcVar5 = '\0';
    cVar9 = *pcVar13;
    if ((cVar9 != '\0') && (cVar9 != ':')) goto LAB_00119678;
  }
  else {
    while ((cVar9 != '\0' && (cVar9 != ':'))) {
      pcVar5 = pcVar13 + 1;
      pcVar13 = pcVar13 + 1;
      cVar9 = *pcVar5;
    }
  }
  if (cVar9 == ':') {
    *pcVar13 = '\0';
    pcVar13 = pcVar13 + 1;
  }
  sVar10 = strlen(url->u_hostname);
  iVar4 = iVar12;
  if (sVar10 < 0x100) {
    if (cVar9 == ':') {
      if ((*pcVar13 == '\0') || (iVar3 = nni_get_port_by_name(pcVar13,&url->u_port), iVar3 != 0))
      goto LAB_00119678;
    }
    else {
      uVar2 = nni_url_default_port(url->u_scheme);
      url->u_port = (uint)uVar2;
    }
    return 0;
  }
LAB_00119678:
  nni_url_fini(url);
  return iVar4;
}

Assistant:

int
nni_url_parse_inline(nng_url *url, const char *raw)
{
	int rv = nni_url_parse_inline_inner(url, raw);
	if (rv != 0) {
		nni_url_fini(url);
	}
	return (rv);
}